

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

CK_RV __thiscall
Token::createToken(Token *this,ObjectStore *objectStore,ByteString *soPIN,CK_UTF8CHAR_PTR label)

{
  _func_int **pp_Var1;
  long *plVar2;
  undefined3 uVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  ObjectStoreToken *pOVar7;
  long in_RCX;
  long in_RSI;
  SecureDataManager *in_RDI;
  ByteString userPINBlob;
  ByteString soPINBlob;
  ObjectStoreToken *newToken;
  SecureDataManager soPINBlobGen;
  ByteString labelByteStr;
  MutexLocker lock;
  CK_ULONG flags;
  SecureDataManager *in_stack_fffffffffffffdb8;
  SecureDataManager *in_stack_fffffffffffffdc0;
  undefined2 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd2;
  undefined1 in_stack_fffffffffffffdd3;
  byte bVar8;
  undefined1 in_stack_fffffffffffffdd4;
  undefined1 in_stack_fffffffffffffdd5;
  byte in_stack_fffffffffffffdd6;
  byte in_stack_fffffffffffffdd7;
  uchar *in_stack_fffffffffffffdd8;
  ByteString *in_stack_fffffffffffffde0;
  byte local_211;
  SecureDataManager *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  byte in_stack_fffffffffffffdff;
  SecureDataManager *in_stack_fffffffffffffe08;
  ObjectStoreToken *in_stack_fffffffffffffe20;
  ObjectStore *in_stack_fffffffffffffe28;
  undefined1 local_1d0 [40];
  undefined1 local_1a8 [40];
  ObjectStoreToken *local_180;
  ByteString *in_stack_fffffffffffffee8;
  ObjectStore *in_stack_fffffffffffffef0;
  undefined1 local_70 [44];
  int local_44;
  undefined2 local_30;
  byte bStack_2e;
  undefined5 uStack_2d;
  long local_28;
  long local_18;
  CK_RV local_8;
  
  local_28 = in_RCX;
  local_18 = in_RSI;
  MutexLocker::MutexLocker
            ((MutexLocker *)in_stack_fffffffffffffdc0,(Mutex *)in_stack_fffffffffffffdb8);
  if (local_18 == 0) {
    local_8 = 5;
    local_44 = 1;
    goto LAB_001eeb7d;
  }
  if (local_28 == 0) {
    local_8 = 7;
    local_44 = 1;
    goto LAB_001eeb7d;
  }
  ByteString::ByteString
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             CONCAT17(in_stack_fffffffffffffdd7,
                      CONCAT16(in_stack_fffffffffffffdd6,
                               CONCAT15(in_stack_fffffffffffffdd5,
                                        CONCAT14(in_stack_fffffffffffffdd4,
                                                 CONCAT13(in_stack_fffffffffffffdd3,
                                                          CONCAT12(in_stack_fffffffffffffdd2,
                                                                   in_stack_fffffffffffffdd0)))))));
  if ((in_RDI->userEncryptedKey).byteString.
      super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
      super__Tp_alloc_type._vptr_SecureAllocator == (_func_int **)0x0) {
    SecureDataManager::SecureDataManager(in_stack_fffffffffffffdf0);
    bVar4 = SecureDataManager::setSOPIN(in_stack_fffffffffffffe08,(ByteString *)in_RDI);
    if (bVar4) {
      pOVar7 = ObjectStore::newToken(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      local_180 = pOVar7;
      if (pOVar7 == (ObjectStoreToken *)0x0) {
        softHSMLog(3,"createToken",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                   ,0x1af,"Could not create the token");
        local_8 = 0x30;
        local_44 = 1;
      }
      else {
        SecureDataManager::getSOPINBlob(in_stack_fffffffffffffdb8);
        iVar6 = (**pOVar7->_vptr_ObjectStoreToken)(pOVar7,local_1a8);
        in_stack_fffffffffffffdd7 = (byte)iVar6;
        in_stack_fffffffffffffdd6 = in_stack_fffffffffffffdd7 ^ 0xff;
        ByteString::~ByteString((ByteString *)0x1ee8e5);
        if ((in_stack_fffffffffffffdd6 & 1) == 0) {
          (in_RDI->userEncryptedKey).byteString.
          super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
          super__Tp_alloc_type._vptr_SecureAllocator = (_func_int **)local_180;
          local_44 = 0;
        }
        else {
          softHSMLog(3,"createToken",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                     ,0x1b6,"Failed to set SO PIN on new token");
          in_stack_fffffffffffffdd5 =
               ObjectStore::destroyToken(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
          if (!(bool)in_stack_fffffffffffffdd5) {
            softHSMLog(3,"createToken",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                       ,0x1ba,"Failed to destroy incomplete token");
          }
          local_8 = 0x30;
          local_44 = 1;
        }
      }
    }
    else {
      local_8 = 5;
      local_44 = 1;
    }
    SecureDataManager::~SecureDataManager
              ((SecureDataManager *)
               CONCAT17(in_stack_fffffffffffffdd7,
                        CONCAT16(in_stack_fffffffffffffdd6,
                                 CONCAT15(in_stack_fffffffffffffdd5,
                                          CONCAT14(in_stack_fffffffffffffdd4,
                                                   CONCAT13(in_stack_fffffffffffffdd3,
                                                            CONCAT12(in_stack_fffffffffffffdd2,
                                                                     in_stack_fffffffffffffdd0))))))
              );
    if (local_44 == 0) {
LAB_001ee9f3:
      ByteString::ByteString((ByteString *)0x1ee9fd);
      ByteString::ByteString((ByteString *)0x1eea09);
      pp_Var1 = (in_RDI->userEncryptedKey).byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                super__Tp_alloc_type._vptr_SecureAllocator;
      bVar5 = (**(code **)(*pp_Var1 + 8))(pp_Var1,local_1d0);
      bVar8 = 0;
      if ((bVar5 & 1) != 0) {
        pp_Var1 = (in_RDI->userEncryptedKey).byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                  super__Tp_alloc_type._vptr_SecureAllocator;
        bVar8 = (**(code **)(*pp_Var1 + 0x18))(pp_Var1,&stack0xfffffffffffffe08);
      }
      *(byte *)&(((_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> *)
                 &(in_RDI->userEncryptedKey)._vptr_ByteString)->_M_impl).super__Tp_alloc_type.
                _vptr_SecureAllocator = bVar8 & 1;
      if (((in_RDI->userEncryptedKey).byteString.
           super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start != (pointer)0x0) &&
         (plVar2 = (long *)(in_RDI->userEncryptedKey).byteString.
                           super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start, plVar2 != (long *)0x0)) {
        (**(code **)(*plVar2 + 8))();
      }
      in_stack_fffffffffffffdc0 = (SecureDataManager *)operator_new(0xd0);
      SecureDataManager::SecureDataManager
                (in_RDI,(ByteString *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                 (ByteString *)in_stack_fffffffffffffdf0);
      (in_RDI->userEncryptedKey).byteString.
      super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffdc0;
      local_8 = 0;
      local_44 = 1;
      ByteString::~ByteString((ByteString *)0x1eeb1f);
      ByteString::~ByteString((ByteString *)0x1eeb29);
    }
  }
  else {
    pp_Var1 = (in_RDI->userEncryptedKey).byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
              super__Tp_alloc_type._vptr_SecureAllocator;
    in_stack_fffffffffffffdff = (**(code **)(*pp_Var1 + 0x20))(pp_Var1,&local_30);
    if ((in_stack_fffffffffffffdff & 1) == 0) {
      softHSMLog(3,"createToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                 ,0x189,"Could not get the token flags");
      local_8 = 5;
      local_44 = 1;
    }
    else {
      SecureDataManager::getSOPINBlob(in_stack_fffffffffffffdb8);
      in_stack_fffffffffffffdf0 = (SecureDataManager *)ByteString::size((ByteString *)0x1ee614);
      local_211 = 0;
      if (in_stack_fffffffffffffdf0 != (SecureDataManager *)0x0) {
        bVar4 = SecureDataManager::loginSO
                          (in_stack_fffffffffffffdc0,(ByteString *)in_stack_fffffffffffffdb8);
        local_211 = bVar4 ^ 0xff;
      }
      ByteString::~ByteString((ByteString *)0x1ee667);
      if ((local_211 & 1) == 0) {
        pp_Var1 = (in_RDI->userEncryptedKey).byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                  super__Tp_alloc_type._vptr_SecureAllocator;
        uVar3 = CONCAT12(bStack_2e,local_30);
        bStack_2e = bStack_2e & 0xef;
        (**(code **)(*pp_Var1 + 0x28))(pp_Var1,CONCAT53(uStack_2d,uVar3) & 0xffffffffffefffff);
        pp_Var1 = (in_RDI->userEncryptedKey).byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                  super__Tp_alloc_type._vptr_SecureAllocator;
        bVar5 = (**(code **)(*pp_Var1 + 0x88))(pp_Var1,local_70);
        if ((bVar5 & 1) != 0) goto LAB_001ee9f3;
        softHSMLog(3,"createToken",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                   ,0x19c,"Could not reset the token");
        local_8 = 0x30;
        local_44 = 1;
      }
      else {
        pp_Var1 = (in_RDI->userEncryptedKey).byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                  super__Tp_alloc_type._vptr_SecureAllocator;
        uVar3 = CONCAT12(bStack_2e,local_30);
        bStack_2e = bStack_2e | 0x10;
        (**(code **)(*pp_Var1 + 0x28))(pp_Var1,CONCAT53(uStack_2d,uVar3) | 0x100000);
        softHSMLog(3,"createToken",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                   ,0x193,"Incorrect SO PIN");
        local_8 = 0xa0;
        local_44 = 1;
      }
    }
  }
  ByteString::~ByteString((ByteString *)0x1eeb6c);
LAB_001eeb7d:
  MutexLocker::~MutexLocker((MutexLocker *)in_stack_fffffffffffffdc0);
  return local_8;
}

Assistant:

CK_RV Token::createToken(ObjectStore* objectStore, ByteString& soPIN, CK_UTF8CHAR_PTR label)
{
	CK_ULONG flags;

	// Lock access to the token
	MutexLocker lock(tokenMutex);

	if (objectStore == NULL) return CKR_GENERAL_ERROR;
	if (label == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Convert the label
	ByteString labelByteStr((const unsigned char*) label, 32);

	if (token != NULL)
	{
		// Get token flags
		if (!token->getTokenFlags(flags))
		{
			ERROR_MSG("Could not get the token flags");
			return CKR_GENERAL_ERROR;
		}

		// Verify SO PIN
		if (sdm->getSOPINBlob().size() > 0 && !sdm->loginSO(soPIN))
		{
			flags |= CKF_SO_PIN_COUNT_LOW;
			token->setTokenFlags(flags);

			ERROR_MSG("Incorrect SO PIN");
			return CKR_PIN_INCORRECT;
		}
		flags &= ~CKF_SO_PIN_COUNT_LOW;
		token->setTokenFlags(flags);

		// Reset the token
		if (!token->resetToken(labelByteStr))
		{
			ERROR_MSG("Could not reset the token");
			return CKR_DEVICE_ERROR;
		}
	}
	else
	{
		// Generate the SO PIN blob
		SecureDataManager soPINBlobGen;

		if (!soPINBlobGen.setSOPIN(soPIN))
		{
			return CKR_GENERAL_ERROR;
		}

		// Create the token
		ObjectStoreToken* newToken = objectStore->newToken(labelByteStr);

		if (newToken == NULL)
		{
			ERROR_MSG("Could not create the token");
			return CKR_DEVICE_ERROR;
		}

		// Set the SO PIN on the token
		if (!newToken->setSOPIN(soPINBlobGen.getSOPINBlob()))
		{
			ERROR_MSG("Failed to set SO PIN on new token");

			if (!objectStore->destroyToken(newToken))
			{
				ERROR_MSG("Failed to destroy incomplete token");
			}

			return CKR_DEVICE_ERROR;
		}

		token = newToken;
	}

	ByteString soPINBlob, userPINBlob;

	valid = token->getSOPIN(soPINBlob) && token->getUserPIN(userPINBlob);

	if (sdm != NULL) delete sdm;
	sdm = new SecureDataManager(soPINBlob, userPINBlob);

	return CKR_OK;
}